

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O1

void Omega_h::transfer_conserve_motion
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,LOs *keys2verts,Graph *keys2elems,
               LOs *same_ents2old_ents,LOs *same_ents2new_ents)

{
  int *piVar1;
  undefined1 auVar2 [12];
  undefined8 uVar3;
  Alloc *pAVar4;
  bool bVar5;
  long lVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  LOs prods2new_ents;
  LOs keys2prods;
  Graph bdry_keys2doms;
  Cavs init_cavs;
  CavsByBdryStatus cavs;
  ulong in_stack_fffffffffffffd74;
  undefined1 local_280 [24];
  pointer local_268;
  Read<int> local_260;
  LOs local_250;
  LOs local_240;
  Alloc *local_230;
  pointer local_228;
  Alloc *local_220;
  pointer local_218;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  LOs local_200;
  LOs local_1f0;
  Graph local_1e0;
  Read<int> local_1c0;
  Read<int> local_1b0;
  LOs local_1a0;
  Cavs local_190;
  LOs *local_150;
  Cavs local_148;
  
  local_150 = same_ents2old_ents;
  bVar5 = should_conserve_any(old_mesh,opts);
  if (bVar5) {
    local_220 = (keys2elems->a2ab).write_.shared_alloc_.alloc;
    if (((ulong)local_220 & 7) == 0 && local_220 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_220 = (Alloc *)(local_220->size * 8 + 1);
      }
      else {
        local_220->use_count = local_220->use_count + 1;
      }
    }
    local_250.write_.shared_alloc_.direct_ptr = (keys2elems->a2ab).write_.shared_alloc_.direct_ptr;
    local_230 = (keys2elems->ab2b).write_.shared_alloc_.alloc;
    if (((ulong)local_230 & 7) == 0 && local_230 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_230 = (Alloc *)(local_230->size * 8 + 1);
      }
      else {
        local_230->use_count = local_230->use_count + 1;
      }
    }
    local_228 = (pointer)(keys2elems->ab2b).write_.shared_alloc_.direct_ptr;
    local_240.write_.shared_alloc_.alloc = (keys2verts->write_).shared_alloc_.alloc;
    if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
        local_240.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_240.write_.shared_alloc_.alloc =
             (Alloc *)((local_240.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_240.write_.shared_alloc_.alloc)->use_count =
             (local_240.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_240.write_.shared_alloc_.direct_ptr = (keys2verts->write_).shared_alloc_.direct_ptr;
    local_250.write_.shared_alloc_.alloc = local_220;
    if (((ulong)local_220 & 7) == 0 && local_220 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_250.write_.shared_alloc_.alloc = (Alloc *)(local_220->size * 8 + 1);
      }
      else {
        local_220->use_count = local_220->use_count + 1;
      }
    }
    local_1a0.write_.shared_alloc_.alloc = local_230;
    if (((ulong)local_230 & 7) == 0 && local_230 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1a0.write_.shared_alloc_.alloc = (Alloc *)(local_230->size * 8 + 1);
      }
      else {
        local_230->use_count = local_230->use_count + 1;
      }
    }
    local_218 = (pointer)local_250.write_.shared_alloc_.direct_ptr;
    local_1a0.write_.shared_alloc_.direct_ptr = local_228;
    form_initial_cavs(&local_190,old_mesh,new_mesh,0,&local_240,&local_250,&local_1a0);
    pAVar4 = local_1a0.write_.shared_alloc_.alloc;
    if (((ulong)local_1a0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1a0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1a0.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    pAVar4 = local_250.write_.shared_alloc_.alloc;
    if (((ulong)local_250.write_.shared_alloc_.alloc & 7) == 0 &&
        local_250.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_250.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_250.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    pAVar4 = local_240.write_.shared_alloc_.alloc;
    if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
        local_240.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_240.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_240.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    local_260.write_.shared_alloc_.alloc = local_190.keys2old_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_190.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_190.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_260.write_.shared_alloc_.alloc =
             (Alloc *)((local_190.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_190.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_190.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_260.write_.shared_alloc_.direct_ptr =
         local_190.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_1b0.write_.shared_alloc_.alloc = local_190.keys2new_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_190.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_190.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1b0.write_.shared_alloc_.alloc =
             (Alloc *)((local_190.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_190.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_190.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_1b0.write_.shared_alloc_.direct_ptr =
         local_190.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr;
    bVar5 = operator==(&local_260,&local_1b0);
    pAVar4 = local_1b0.write_.shared_alloc_.alloc;
    if (!bVar5) {
      fail("assertion %s failed at %s +%d\n",
           "init_cavs.keys2old_elems.a2ab == init_cavs.keys2new_elems.a2ab",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_conserve.cpp"
           ,0x21b);
    }
    if (((ulong)local_1b0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1b0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1b0.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    pAVar4 = local_260.write_.shared_alloc_.alloc;
    if (((ulong)local_260.write_.shared_alloc_.alloc & 7) == 0 &&
        local_260.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_260.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_260.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    local_280._16_8_ = local_190.keys2old_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_190.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_190.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_280._16_8_ = (local_190.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1;
      }
      else {
        (local_190.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_190.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_268 = (pointer)local_190.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_1c0.write_.shared_alloc_.alloc = local_190.keys2new_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_190.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_190.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1c0.write_.shared_alloc_.alloc =
             (Alloc *)((local_190.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_190.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_190.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_1c0.write_.shared_alloc_.direct_ptr =
         local_190.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr;
    bVar5 = operator==((Read<int> *)(local_280 + 0x10),&local_1c0);
    pAVar4 = local_1c0.write_.shared_alloc_.alloc;
    if (!bVar5) {
      fail("assertion %s failed at %s +%d\n",
           "init_cavs.keys2old_elems.ab2b == init_cavs.keys2new_elems.ab2b",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_conserve.cpp"
           ,0x21c);
    }
    if (((ulong)local_1c0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1c0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1c0.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    uVar3 = local_280._16_8_;
    if ((local_280._16_8_ & 7) == 0 && (Alloc *)local_280._16_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_280._16_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_280._16_8_);
        operator_delete((void *)uVar3,0x48);
      }
    }
    local_1e0.a2ab.write_.shared_alloc_.alloc = (keys2elems->a2ab).write_.shared_alloc_.alloc;
    if (((ulong)local_1e0.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1e0.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1e0.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_1e0.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1e0.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_1e0.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_1e0.a2ab.write_.shared_alloc_.direct_ptr =
         (keys2elems->a2ab).write_.shared_alloc_.direct_ptr;
    local_1e0.ab2b.write_.shared_alloc_.alloc = (keys2elems->ab2b).write_.shared_alloc_.alloc;
    if (((ulong)local_1e0.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1e0.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1e0.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_1e0.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1e0.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_1e0.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_1e0.ab2b.write_.shared_alloc_.direct_ptr =
         (keys2elems->ab2b).write_.shared_alloc_.direct_ptr;
    local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
         local_190.keys2old_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_190.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_190.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_190.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_190.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_190.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_148.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
         local_190.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
         local_190.keys2old_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_190.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_190.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_190.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_190.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_190.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_148.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
         local_190.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
         local_190.keys2new_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_190.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_190.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_190.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_190.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_190.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_148.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
         local_190.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
         local_190.keys2new_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_190.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_190.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_190.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_190.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_190.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_148.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
         local_190.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_1f0.write_.shared_alloc_.alloc = (keys2verts->write_).shared_alloc_.alloc;
    if (((ulong)local_1f0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1f0.write_.shared_alloc_.alloc =
             (Alloc *)((local_1f0.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1f0.write_.shared_alloc_.alloc)->use_count =
             (local_1f0.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_1f0.write_.shared_alloc_.direct_ptr = (keys2verts->write_).shared_alloc_.direct_ptr;
    separate_cavities((CavsByBdryStatus *)&stack0xfffffffffffffef8,old_mesh,new_mesh,&local_148,0,
                      &local_1f0,&local_1e0);
    pAVar4 = local_1f0.write_.shared_alloc_.alloc;
    if (((ulong)local_1f0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1f0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1f0.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    Cavs::~Cavs(&local_148);
    local_280._0_8_ = (local_150->write_).shared_alloc_.alloc;
    if ((local_280._0_8_ & 7) == 0 && (Alloc *)local_280._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_280._0_8_ = ((Alloc *)local_280._0_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_280._0_8_)->use_count = ((Alloc *)local_280._0_8_)->use_count + 1;
      }
    }
    local_280._8_8_ = (local_150->write_).shared_alloc_.direct_ptr;
    local_200.write_.shared_alloc_.alloc = (same_ents2new_ents->write_).shared_alloc_.alloc;
    if (((ulong)local_200.write_.shared_alloc_.alloc & 7) == 0 &&
        local_200.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_200.write_.shared_alloc_.alloc =
             (Alloc *)((local_200.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_200.write_.shared_alloc_.alloc)->use_count =
             (local_200.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_200.write_.shared_alloc_.direct_ptr =
         (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
    local_210 = 0x1000101;
    uStack_20c = 0;
    uStack_208 = 0;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = in_stack_fffffffffffffd74;
    transfer_conservation_errors
              ((Omega_h *)old_mesh,(Mesh *)opts,(TransferOpts *)new_mesh,
               (Mesh *)&stack0xfffffffffffffef8,(CavsByBdryStatus *)local_280,&local_200,
               (LOs *)0x1000101,(OpConservation)(auVar2 << 0x20));
    pAVar4 = local_200.write_.shared_alloc_.alloc;
    if (((ulong)local_200.write_.shared_alloc_.alloc & 7) == 0 &&
        local_200.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_200.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_200.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    uVar3 = local_280._0_8_;
    if ((local_280._0_8_ & 7) == 0 && (Alloc *)local_280._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_280._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_280._0_8_);
        operator_delete((void *)uVar3,0x48);
      }
    }
    puVar7 = &stack0xffffffffffffffd0;
    puVar8 = &stack0xfffffffffffffef8;
    do {
      lVar6 = 0xc0;
      do {
        std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector
                  ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)(puVar8 + lVar6));
        pAVar4 = local_1e0.ab2b.write_.shared_alloc_.alloc;
        lVar6 = lVar6 + -0x18;
      } while (lVar6 != 0x78);
      puVar7 = puVar7 + -0x48;
      puVar8 = puVar8 + -0x48;
    } while (puVar7 != &stack0xfffffffffffffef8);
    if (((ulong)local_1e0.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1e0.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1e0.ab2b.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1e0.ab2b.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    pAVar4 = local_1e0.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_1e0.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1e0.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1e0.a2ab.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1e0.a2ab.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    Cavs::~Cavs(&local_190);
    pAVar4 = local_230;
    if (((ulong)local_230 & 7) == 0 && local_230 != (Alloc *)0x0) {
      piVar1 = &local_230->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_230);
        operator_delete(pAVar4,0x48);
      }
    }
    pAVar4 = local_220;
    if (((ulong)local_220 & 7) == 0 && local_220 != (Alloc *)0x0) {
      piVar1 = &local_220->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_220);
        operator_delete(pAVar4,0x48);
      }
    }
  }
  return;
}

Assistant:

void transfer_conserve_motion(Mesh* old_mesh, TransferOpts const& opts,
    Mesh* new_mesh, LOs keys2verts, Graph keys2elems, LOs same_ents2old_ents,
    LOs same_ents2new_ents) {
  if (!should_conserve_any(old_mesh, opts)) return;
  auto keys2prods = keys2elems.a2ab;
  auto prods2new_ents = keys2elems.ab2b;
  auto init_cavs = form_initial_cavs(
      old_mesh, new_mesh, VERT, keys2verts, keys2prods, prods2new_ents);
  OMEGA_H_CHECK(init_cavs.keys2old_elems.a2ab == init_cavs.keys2new_elems.a2ab);
  OMEGA_H_CHECK(init_cavs.keys2old_elems.ab2b == init_cavs.keys2new_elems.ab2b);
  auto bdry_keys2doms = keys2elems;
  auto cavs = separate_cavities(
      old_mesh, new_mesh, init_cavs, VERT, keys2verts, &bdry_keys2doms);
  OpConservation op_conservation;
  op_conservation.density.this_time[NOT_BDRY] = true;
  op_conservation.density.this_time[TOUCH_BDRY] = true;
  op_conservation.density.this_time[KEY_BDRY] = false;
  op_conservation.momentum.this_time[NOT_BDRY] = false;
  op_conservation.momentum.this_time[TOUCH_BDRY] = false;
  op_conservation.momentum.this_time[KEY_BDRY] = false;
  transfer_conservation_errors(old_mesh, opts, new_mesh, cavs,
      same_ents2old_ents, same_ents2new_ents, op_conservation);
}